

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char *pcVar1;
  char cVar2;
  xml_node_struct *pxVar3;
  long lVar4;
  xml_node xVar5;
  xml_node_struct **ppxVar6;
  xml_node *this_00;
  long lVar7;
  long lVar8;
  char_t *pcVar9;
  char_t *pcVar10;
  char_t *path__00;
  xml_node local_40;
  xml_node local_38;
  
  if (*path_ == delimiter) {
    pxVar3 = this->_root;
    if (pxVar3 == (xml_node_struct *)0x0) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    local_38._root = (xml_node_struct *)(*(long *)((long)pxVar3 - (pxVar3->header >> 8)) + -0x40);
  }
  else {
    local_38 = (xml_node)this->_root;
    if (local_38._root == (xml_node_struct *)0x0) {
      return (xml_node)(xml_node_struct *)0x0;
    }
  }
  pcVar10 = path_ + -3;
  do {
    pcVar9 = pcVar10;
    cVar2 = pcVar9[3];
    pcVar10 = pcVar9 + 1;
  } while (cVar2 == delimiter);
  lVar8 = 0;
  do {
    lVar7 = lVar8;
    lVar8 = lVar7 + 1;
    if (pcVar9[lVar7 + 3] == '\0') break;
  } while (pcVar9[lVar7 + 3] != delimiter);
  if (lVar8 == 1) {
    return (xml_node)local_38._root;
  }
  pcVar10 = pcVar9 + 1 + lVar8;
  do {
    path__00 = pcVar10 + 1;
    pcVar1 = pcVar10 + 1;
    pcVar10 = path__00;
  } while (*pcVar1 == delimiter);
  if (lVar8 == 2 && cVar2 == '.') {
    this_00 = &local_38;
  }
  else {
    if (((cVar2 != '.') || (lVar8 != 3)) || (pcVar9[4] != '.')) {
      ppxVar6 = &(local_38._root)->first_child;
      do {
        pxVar3 = *ppxVar6;
        if (pxVar3 == (xml_node_struct *)0x0) {
          return (xml_node)(xml_node_struct *)0x0;
        }
        pcVar10 = pxVar3->name;
        if (pcVar10 != (char_t *)0x0) {
          lVar8 = 0;
          do {
            if (lVar7 == lVar8) {
              if ((pcVar10[lVar7] == '\0') &&
                 (local_40._root = pxVar3,
                 xVar5 = first_element_by_path(&local_40,path__00,delimiter),
                 xVar5._root != (xml_node_struct *)0x0)) {
                return (xml_node)xVar5._root;
              }
              break;
            }
            pcVar1 = pcVar10 + lVar8;
            lVar4 = lVar8 + 3;
            lVar8 = lVar8 + 1;
          } while (*pcVar1 == pcVar9[lVar4]);
        }
        ppxVar6 = &pxVar3->next_sibling;
      } while( true );
    }
    local_40._root = (local_38._root)->parent;
    this_00 = &local_40;
  }
  xVar5 = first_element_by_path(this_00,path__00,delimiter);
  return (xml_node)xVar5._root;
}

Assistant:

PUGI__FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node context = path_[0] == delimiter ? root() : *this;

		if (!context._root) return xml_node();

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return context;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return context.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return context.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = context._root->first_child; j; j = j->next_sibling)
			{
				const char_t* jname = j->name;
				if (jname && impl::strequalrange(jname, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}